

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O2

UInt32 LitEnc_GetPriceMatched(UInt16 *probs,UInt32 symbol,UInt32 matchByte,UInt32 *ProbPrices)

{
  UInt32 UVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = symbol | 0x100;
  uVar3 = 0x100;
  UVar1 = 0;
  do {
    matchByte = matchByte * 2;
    UVar1 = UVar1 + ProbPrices
                    [((uint)(int)(char)uVar2 >> 7 & 0x7f0 ^
                     (uint)probs[(uVar2 >> 8) + uVar3 + (uVar3 & matchByte)]) >> 4];
    uVar2 = uVar2 * 2;
    uVar3 = uVar3 & ~(matchByte ^ uVar2);
  } while (uVar2 < 0x10000);
  return UVar1;
}

Assistant:

static UInt32 LitEnc_GetPriceMatched(const CLzmaProb *probs, UInt32 symbol, UInt32 matchByte, const UInt32 *ProbPrices)
{
  UInt32 price = 0;
  UInt32 offs = 0x100;
  symbol |= 0x100;
  do
  {
    matchByte <<= 1;
    price += GET_PRICEa(probs[offs + (matchByte & offs) + (symbol >> 8)], (symbol >> 7) & 1);
    symbol <<= 1;
    offs &= ~(matchByte ^ symbol);
  }
  while (symbol < 0x10000);
  return price;
}